

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

void Curl_flush_cookies(Curl_easy *data,_Bool cleanup)

{
  CookieInfo *cookies;
  byte *newpath;
  curl_slist *list;
  CURLcode CVar1;
  int iVar2;
  char *__filename;
  FILE *__stream;
  void *__base;
  long lVar3;
  char *pcVar4;
  Cookie *pCVar5;
  uint uVar6;
  uint uVar7;
  size_t __nmemb;
  uchar local_39 [9];
  
  if ((data->set).str[5] == (char *)0x0) {
    if ((cleanup) && (list = (data->change).cookielist, list != (curl_slist *)0x0)) {
      curl_slist_free_all(list);
      (data->change).cookielist = (curl_slist *)0x0;
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    goto LAB_0010f523;
  }
  if ((data->change).cookielist != (curl_slist *)0x0) {
    Curl_cookie_loadfiles(data);
  }
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  cookies = data->cookies;
  if (cookies == (CookieInfo *)0x0) goto LAB_0010f523;
  newpath = (byte *)(data->set).str[5];
  remove_expired(cookies);
  uVar6 = *newpath - 0x2d;
  if (uVar6 == 0) {
    uVar6 = (uint)newpath[1];
  }
  if (uVar6 == 0) {
    __filename = (char *)0x0;
    __stream = _stdout;
LAB_0010f383:
    fputs("# Netscape HTTP Cookie File\n# https://curl.haxx.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
          ,__stream);
    if (cookies->numcookies != 0) {
      __base = (*Curl_ccalloc)(1,cookies->numcookies << 3);
      if (__base == (void *)0x0) {
LAB_0010f4e5:
        if (__stream != (FILE *)0x0 && uVar6 != 0) {
          fclose(__stream);
        }
        goto LAB_0010f4ff;
      }
      __nmemb = 0;
      for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
        pCVar5 = (Cookie *)(cookies->cookies + lVar3);
        while (pCVar5 = pCVar5->next, pCVar5 != (Cookie *)0x0) {
          if (pCVar5->domain != (char *)0x0) {
            *(Cookie **)((long)__base + __nmemb * 8) = pCVar5;
            __nmemb = __nmemb + 1;
          }
        }
      }
      qsort(__base,__nmemb,8,cookie_sort_ct);
      for (uVar7 = 0; uVar7 < __nmemb; uVar7 = uVar7 + 1) {
        pcVar4 = get_netscape_format(*(Cookie **)((long)__base + (ulong)uVar7 * 8));
        if (pcVar4 == (char *)0x0) {
          curl_mfprintf((FILE *)__stream,"#\n# Fatal libcurl error\n");
          (*Curl_cfree)(__base);
          goto LAB_0010f4e5;
        }
        curl_mfprintf((FILE *)__stream,"%s\n",pcVar4);
        (*Curl_cfree)(pcVar4);
      }
      (*Curl_cfree)(__base);
    }
    if (__stream != (FILE *)0x0 && uVar6 != 0) {
      fclose(__stream);
      iVar2 = Curl_rename(__filename,(char *)newpath);
      if (iVar2 != 0) {
        unlink(__filename);
        goto LAB_0010f4ff;
      }
    }
    (*Curl_cfree)(__filename);
  }
  else {
    CVar1 = Curl_rand_hex(data,local_39,9);
    if ((CVar1 == CURLE_OK) &&
       (__filename = curl_maprintf("%s.%s.tmp",newpath,local_39), __filename != (char *)0x0)) {
      __stream = fopen64(__filename,"w");
      if (__stream != (FILE *)0x0) goto LAB_0010f383;
LAB_0010f4ff:
      (*Curl_cfree)(__filename);
    }
    Curl_infof(data,"WARNING: failed to save cookies in %s\n",(data->set).str[5]);
  }
LAB_0010f523:
  if (cleanup) {
    if ((data->share == (Curl_share *)0x0) || (data->cookies != data->share->cookies)) {
      Curl_cookie_cleanup(data->cookies);
      data->cookies = (CookieInfo *)0x0;
    }
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, bool cleanup)
{
  if(data->set.str[STRING_COOKIEJAR]) {
    if(data->change.cookielist) {
      /* If there is a list of cookie files to read, do it first so that
         we have all the told files read before we write the new jar.
         Curl_cookie_loadfiles() LOCKS and UNLOCKS the share itself! */
      Curl_cookie_loadfiles(data);
    }

    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    if(cookie_output(data, data->cookies, data->set.str[STRING_COOKIEJAR]))
      infof(data, "WARNING: failed to save cookies in %s\n",
            data->set.str[STRING_COOKIEJAR]);
  }
  else {
    if(cleanup && data->change.cookielist) {
      /* since nothing is written, we can just free the list of cookie file
         names */
      curl_slist_free_all(data->change.cookielist); /* clean up list */
      data->change.cookielist = NULL;
    }
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = NULL;
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}